

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O1

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
__thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>>::
construct<tchecker::clockval_t_const&>
          (pool_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>> *this,
          clockval_t *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  undefined8 uVar4;
  refcount_t *refcount;
  undefined8 *puVar5;
  ushort *in_RDX;
  long lVar6;
  
  puVar5 = (undefined8 *)
           pool_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::allocate
                     ((pool_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_> *)
                      args);
  if (puVar5 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    uVar3 = *in_RDX;
    *(ushort *)(puVar5 + 1) = uVar3;
    if (uVar3 != 0) {
      lVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)in_RDX + lVar6 + 8);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)puVar5 + lVar6 + 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar3 * 0x10 != lVar6);
    }
    *puVar5 = 0;
    *(undefined8 *)this = 0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
    reset((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
           *)this,(make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)(puVar5 + 1));
  }
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
         )(make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }